

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

void __thiscall String::clear(String *this)

{
  usize *puVar1;
  Data *pDVar2;
  
  pDVar2 = this->data;
  if (pDVar2->ref == 1) {
    pDVar2->len = 0;
    *pDVar2->str = '\0';
    return;
  }
  if (pDVar2->ref != 0) {
    LOCK();
    puVar1 = &pDVar2->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (this->data != (Data *)0x0)) {
      operator_delete__(this->data);
    }
  }
  this->data = &emptyData.super_Data;
  return;
}

Assistant:

void clear()
  {
    if(data->ref == 1)
    {
      data->len = 0;
      *(char*)data->str = '\0';
    }
    else
    {
      if(data->ref && Atomic::decrement(data->ref) == 0)
        delete[] (char*)data;

      data = &emptyData;
    }
  }